

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O1

void Ga2_ManStop(Ga2_Man_t *p)

{
  int *__ptr;
  sat_solver2 *psVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  Vec_Int_t *pVVar4;
  uint level;
  long lVar6;
  Gia_Man_t *pGVar5;
  
  pGVar5 = p->pGia;
  if (pGVar5->vMapping != (Vec_Int_t *)0x0) {
    __ptr = pGVar5->vMapping->pArray;
    if (__ptr != (int *)0x0) {
      free(__ptr);
      pGVar5->vMapping->pArray = (int *)0x0;
    }
    if (pGVar5->vMapping != (Vec_Int_t *)0x0) {
      free(pGVar5->vMapping);
      pGVar5->vMapping = (Vec_Int_t *)0x0;
    }
  }
  pGVar5 = p->pGia;
  Gia_ManSetPhase(pGVar5);
  level = (uint)pGVar5;
  if (p->pPars->fVerbose != 0) {
    psVar1 = p->pSat;
    level = psVar1->nDBreduces;
    Abc_Print(level,
              "SAT solver:  Var = %d  Cla = %d  Conf = %d  Lrn = %d  Reduce = %d  Cex = %d  ObjsAdded = %d\n"
              ,(ulong)(uint)psVar1->size,(ulong)(psVar1->stats).clauses,
              (ulong)(uint)(psVar1->stats).conflicts,(ulong)(psVar1->stats).learnts,(ulong)level,
              (ulong)(uint)p->nCexes,(ulong)(uint)p->nObjAdded);
  }
  if (p->pPars->fVerbose != 0) {
    Abc_Print(level,"Hash hits = %d.  Hash misses = %d.  Hash overs = %d.  Concurrent calls = %d.\n"
              ,(ulong)(uint)p->nHashHit,(ulong)(uint)p->nHashMiss,(ulong)(uint)p->nHashOver,
              (ulong)(uint)p->nPdrCalls);
  }
  if (p->pSat != (sat_solver2 *)0x0) {
    sat_solver2_delete(p->pSat);
  }
  pVVar2 = p->vCnfs;
  if (0 < pVVar2->nSize) {
    lVar6 = 0;
    do {
      pvVar3 = pVVar2->pArray[lVar6];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
          *(undefined8 *)((long)pvVar3 + 8) = 0;
        }
        free(pvVar3);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar2->nSize);
  }
  if (pVVar2->pArray != (void **)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (void **)0x0;
  }
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vId2Lit;
  if (0 < pVVar2->nSize) {
    lVar6 = 0;
    do {
      pvVar3 = pVVar2->pArray[lVar6];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
          *(undefined8 *)((long)pvVar3 + 8) = 0;
        }
        free(pvVar3);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar2->nSize);
  }
  if (pVVar2->pArray != (void **)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (void **)0x0;
  }
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    free(pVVar2);
  }
  pVVar4 = p->vIds;
  if (pVVar4->pArray != (int *)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (int *)0x0;
  }
  if (pVVar4 != (Vec_Int_t *)0x0) {
    free(pVVar4);
  }
  pVVar4 = p->vProofIds;
  if (pVVar4->pArray != (int *)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (int *)0x0;
  }
  if (pVVar4 != (Vec_Int_t *)0x0) {
    free(pVVar4);
  }
  pVVar4 = p->vAbs;
  if (pVVar4->pArray != (int *)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (int *)0x0;
  }
  if (pVVar4 != (Vec_Int_t *)0x0) {
    free(pVVar4);
  }
  pVVar4 = p->vValues;
  if (pVVar4->pArray != (int *)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (int *)0x0;
  }
  if (pVVar4 != (Vec_Int_t *)0x0) {
    free(pVVar4);
  }
  pVVar4 = p->vLits;
  if (pVVar4->pArray != (int *)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (int *)0x0;
  }
  if (pVVar4 != (Vec_Int_t *)0x0) {
    free(pVVar4);
  }
  pVVar4 = p->vIsopMem;
  if (pVVar4->pArray != (int *)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (int *)0x0;
  }
  if (pVVar4 != (Vec_Int_t *)0x0) {
    free(pVVar4);
  }
  Rnm_ManStop(p->pRnm,0);
  if (p->pTable != (int *)0x0) {
    free(p->pTable);
    p->pTable = (int *)0x0;
  }
  if (p->pSopSizes != (char *)0x0) {
    free(p->pSopSizes);
    p->pSopSizes = (char *)0x0;
  }
  if (p->pSops[1] != (char *)0x0) {
    free(p->pSops[1]);
    p->pSops[1] = (char *)0x0;
  }
  if (p->pSops != (char **)0x0) {
    free(p->pSops);
    p->pSops = (char **)0x0;
  }
  free(p);
  return;
}

Assistant:

void Ga2_ManStop( Ga2_Man_t * p )
{
    Vec_IntFreeP( &p->pGia->vMapping );
    Gia_ManSetPhase( p->pGia );
    if ( p->pPars->fVerbose )
        Abc_Print( 1, "SAT solver:  Var = %d  Cla = %d  Conf = %d  Lrn = %d  Reduce = %d  Cex = %d  ObjsAdded = %d\n", 
            sat_solver2_nvars(p->pSat), sat_solver2_nclauses(p->pSat), 
            sat_solver2_nconflicts(p->pSat), sat_solver2_nlearnts(p->pSat), 
            p->pSat->nDBreduces, p->nCexes, p->nObjAdded );
    if ( p->pPars->fVerbose )
    Abc_Print( 1, "Hash hits = %d.  Hash misses = %d.  Hash overs = %d.  Concurrent calls = %d.\n", 
        p->nHashHit, p->nHashMiss, p->nHashOver, p->nPdrCalls );

    if( p->pSat ) sat_solver2_delete( p->pSat );
    Vec_VecFree( (Vec_Vec_t *)p->vCnfs );
    Vec_VecFree( (Vec_Vec_t *)p->vId2Lit );
    Vec_IntFree( p->vIds );
    Vec_IntFree( p->vProofIds );
    Vec_IntFree( p->vAbs );
    Vec_IntFree( p->vValues );
    Vec_IntFree( p->vLits );
    Vec_IntFree( p->vIsopMem );
    Rnm_ManStop( p->pRnm, 0 );
//    Rf2_ManStop( p->pRf2, p->pPars->fVerbose );
    ABC_FREE( p->pTable );
    ABC_FREE( p->pSopSizes );
    ABC_FREE( p->pSops[1] );
    ABC_FREE( p->pSops );
    ABC_FREE( p );
}